

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O3

unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
 __thiscall
so_5::details::
make_message_instance_impl<false,so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>::
make<so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>,int_const&>
          (make_message_instance_impl<false,so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
           *this,outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
                 *args,int *args_1)

{
  int iVar1;
  stats_controller_t<so_5::details::actual_lock_holder_t> *psVar2;
  message_t *this_00;
  
  this_00 = (message_t *)operator_new(0x28);
  psVar2 = args->m_ptr;
  iVar1 = *args_1;
  message_t::message_t(this_00);
  *(message_t **)this = this_00;
  this_00->_vptr_message_t = (_func_int **)&PTR__signal_t_00287188;
  this_00[1]._vptr_message_t = (_func_int **)&psVar2->super_next_turn_handler_t;
  *(int *)&this_00[1].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i = iVar1;
  return (__uniq_ptr_data<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>,_true,_true>
          )(__uniq_ptr_data<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}